

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Wasm::PolymorphicEmitInfo::Init(PolymorphicEmitInfo *this,EmitInfo info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((ulong)info >> 0x20 == 0) {
    if (info.super_EmitInfoBase.location.location != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x89b,"(info.location == Js::Constants::NoRegister)",
                         "info.location == Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this->count = 0;
    (this->field_1).infos = (EmitInfo *)0x0;
  }
  else {
    this->count = 1;
    (this->field_1).singleInfo.super_EmitInfoBase.location =
         info.super_EmitInfoBase.location.location;
    (this->field_1).singleInfo.type = info.type;
  }
  return;
}

Assistant:

void PolymorphicEmitInfo::Init(EmitInfo info)
{
    if (info.type != WasmTypes::Void)
    {
        count = 1;
        singleInfo = info;
    }
    else
    {
        Assert(info.location == Js::Constants::NoRegister);
        count = 0;
        infos = nullptr;
    }
}